

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level.cxx
# Opt level: O0

bool __thiscall xray_re::xr_level::load(xr_level *this,char *game_data_path,char *level_path)

{
  bool bVar1;
  uint16_t uVar2;
  uint xrlc_version_00;
  size_t sVar3;
  char local_c8 [8];
  char buf [124];
  uint32_t xrlc_version;
  bool status;
  xr_reader *r;
  xr_file_system *fs;
  char *level_path_local;
  char *game_data_path_local;
  xr_level *this_local;
  
  fs = (xr_file_system *)level_path;
  level_path_local = game_data_path;
  game_data_path_local = (char *)this;
  r = (xr_reader *)xr_file_system::instance();
  _xrlc_version = xr_file_system::r_open((xr_file_system *)r,(char *)fs,"level");
  if (_xrlc_version == (xr_reader *)0x0) {
    return false;
  }
  bVar1 = false;
  sVar3 = xr_reader::find_chunk(_xrlc_version,1);
  if (sVar3 != 0) {
    uVar2 = xr_reader::r_u16(_xrlc_version);
    xrlc_version_00 = (uint)uVar2;
    uVar2 = xr_reader::r_u16(_xrlc_version);
    this->m_xrlc_quality = (uint)uVar2;
    if ((xrlc_version_00 == 5) || (xrlc_version_00 == 8)) {
      xr_reader::r_cseq<char>(_xrlc_version,0x7c,local_c8);
    }
    else if (5 < xrlc_version_00 - 9) {
      msg("unknown xrLC version %u",(ulong)xrlc_version_00);
      goto LAB_001c8c16;
    }
    xr_reader::debug_find_chunk(_xrlc_version);
    load(this,xrlc_version_00,level_path_local,(char *)fs,_xrlc_version);
    bVar1 = true;
  }
LAB_001c8c16:
  xr_file_system::r_close((xr_file_system *)r,(xr_reader **)&xrlc_version);
  return bVar1;
}

Assistant:

bool xr_level::load(const char* game_data_path, const char* level_path)
{
	xr_file_system& fs = xr_file_system::instance();
	xr_reader* r = fs.r_open(level_path, "level");
	if (r == 0)
		return false;
	bool status = false;
	if (r->find_chunk(FSL_HEADER)) {
		uint32_t xrlc_version = r->r_u16();
		m_xrlc_quality = r->r_u16();
		switch (xrlc_version) {
		case XRLC_VERSION_5:
		case XRLC_VERSION_8:
			{
				char buf[124];
				r->r_cseq(sizeof(buf), buf);
			}
			// fall through
		case XRLC_VERSION_9:
		case XRLC_VERSION_10:
		case XRLC_VERSION_11:
		case XRLC_VERSION_12:
		case XRLC_VERSION_13:
		case XRLC_VERSION_14:
			r->debug_find_chunk();
			load(xrlc_version, game_data_path, level_path, *r);
			status = true;
			break;
		default:
			msg("unknown xrLC version %" PRIu32, xrlc_version);
			break;
		}
	}
	fs.r_close(r);
	return status;
}